

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::start(thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
        *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  thread *ptVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  runtime_error *this_01;
  lock_guard locker;
  undefined1 local_49;
  thread *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  unique_lock<std::mutex> local_38;
  _Bind<void_(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>::*(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*))()>
  local_28;
  
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  if ((this->
      super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
      ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this->m_shutdown = false;
    local_28._M_f =
         (offset_in_thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_to_subr
          )body;
    local_28._8_8_ = 0;
    local_48 = (element_type *)0x0;
    local_28._M_bound_args.
    super__Tuple_impl<0UL,_timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*>
    .
    super__Head_base<0UL,_timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*>
          )(_Tuple_impl<0UL,_timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_*>
            )this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::thread,std::allocator<std::thread>,std::_Bind<void(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::*(timertt::details::thread_impl_template<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>*))()>>
              (&_Stack_40,&local_48,(allocator<std::thread> *)&local_49,&local_28);
    _Var2._M_pi = _Stack_40._M_pi;
    ptVar1 = local_48;
    local_48 = (thread *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->
              super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
              ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->
    super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
    ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ptVar1;
    (this->
    super_basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
    ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"timer thread is already started");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
	start()
	{
		typename base_type::lock_guard locker{ *this };

		if( this->m_thread )
			throw std::runtime_error( "timer thread is already started" );
		else
			this->m_shutdown = false;

		this->m_thread = std::make_shared< std::thread >(
				std::bind( &thread_impl_template::body, this ) );
	}